

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Datetime.cpp
# Opt level: O3

bool __thiscall Datetime::parse_date_time_ext(Datetime *this,Pig *pig)

{
  bool bVar1;
  size_type previous;
  
  previous = Pig::cursor(pig);
  bVar1 = parse_date_ext(this,pig);
  if ((bVar1) && (bVar1 = Pig::skip(pig,0x54), bVar1)) {
    bVar1 = parse_time_utc_ext(this,pig);
    if (bVar1) {
      return true;
    }
    bVar1 = parse_time_off_ext(this,pig);
    if (bVar1) {
      return true;
    }
    bVar1 = parse_time_ext(this,pig,true);
    if (bVar1) {
      return true;
    }
  }
  Pig::restoreTo(pig,previous);
  return false;
}

Assistant:

bool Datetime::parse_date_time_ext (Pig& pig)
{
  auto checkpoint = pig.cursor ();

  if (parse_date_ext (pig) &&
      pig.skip ('T')       &&
      (parse_time_utc_ext (pig) ||
       parse_time_off_ext (pig) ||
       parse_time_ext     (pig)))
  {
    return true;
  }

  pig.restoreTo (checkpoint);
  return false;
}